

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O0

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
duckdb::SetSortedByInfo::Deserialize(Deserializer *deserializer)

{
  Deserializer *in_RSI;
  unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_> in_RDI;
  unique_ptr<duckdb::SetSortedByInfo,_std::default_delete<duckdb::SetSortedByInfo>,_true> result;
  pointer pSVar1;
  SetSortedByInfo *in_stack_ffffffffffffffb0;
  vector<duckdb::OrderByNode,_true> *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  field_id_t in_stack_ffffffffffffffee;
  Deserializer *this;
  
  operator_new(0x90);
  SetSortedByInfo(in_stack_ffffffffffffffb0);
  pSVar1 = (pointer)&stack0xffffffffffffffe8;
  unique_ptr<duckdb::SetSortedByInfo,std::default_delete<duckdb::SetSortedByInfo>,true>::
  unique_ptr<std::default_delete<duckdb::SetSortedByInfo>,void>
            ((unique_ptr<duckdb::SetSortedByInfo,_std::default_delete<duckdb::SetSortedByInfo>,_true>
              *)in_stack_ffffffffffffffb0,pSVar1);
  this = in_RSI;
  unique_ptr<duckdb::SetSortedByInfo,_std::default_delete<duckdb::SetSortedByInfo>,_true>::
  operator->((unique_ptr<duckdb::SetSortedByInfo,_std::default_delete<duckdb::SetSortedByInfo>,_true>
              *)in_RSI);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::OrderByNode,true>>
            (this,in_stack_ffffffffffffffee,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  unique_ptr<duckdb::AlterTableInfo,std::default_delete<duckdb::AlterTableInfo>,true>::
  unique_ptr<duckdb::SetSortedByInfo,std::default_delete<std::unique_ptr<duckdb::AlterTableInfo,std::default_delete<duckdb::AlterTableInfo>>>,void>
            ((unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
              *)in_RSI,
             (unique_ptr<duckdb::SetSortedByInfo,_std::default_delete<duckdb::SetSortedByInfo>_> *)
             pSVar1);
  unique_ptr<duckdb::SetSortedByInfo,_std::default_delete<duckdb::SetSortedByInfo>,_true>::
  ~unique_ptr((unique_ptr<duckdb::SetSortedByInfo,_std::default_delete<duckdb::SetSortedByInfo>,_true>
               *)0xae450e);
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (__uniq_ptr_impl<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>
         .super__Head_base<0UL,_duckdb::AlterTableInfo_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<AlterTableInfo> SetSortedByInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SetSortedByInfo>(new SetSortedByInfo());
	deserializer.ReadPropertyWithDefault<vector<OrderByNode>>(400, "orders", result->orders);
	return std::move(result);
}